

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

bool efsw::FileInfo::exists(string *filePath)

{
  bool bVar1;
  FileInfo fi;
  FileInfo local_50;
  
  FileInfo(&local_50,filePath);
  bVar1 = exists(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool FileInfo::exists( const std::string& filePath ) {
	FileInfo fi( filePath );
	return fi.exists();
}